

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_nav2D.cpp
# Opt level: O2

int __thiscall EnvironmentNAV2D::GetGoalHeuristic(EnvironmentNAV2D *this,int stateID)

{
  int iVar1;
  
  iVar1 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[2])
                    (this,stateID,(ulong)(uint)(this->EnvNAV2D).goalstateid);
  return iVar1;
}

Assistant:

int EnvironmentNAV2D::GetGoalHeuristic(int stateID)
{
#if USE_HEUR==0
    return 0;
#endif

#if DEBUG
    if (stateID >= (int)EnvNAV2D.StateID2CoordTable.size()) {
        throw SBPL_Exception("EnvNAV2D... function: stateID illegal");
    }
#endif

    //define this function if it used in the planner (heuristic forward search would use it)
    return GetFromToHeuristic(stateID, EnvNAV2D.goalstateid);
}